

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O2

void __thiscall Clasp::SatElite::addToSubQueue(SatElite *this,uint32 clauseId)

{
  undefined1 *puVar1;
  uint local_14;
  
  if (((this->super_SatPreprocessor).clauses_.ebo_.buf[clauseId]->field_0xb & 0x40) == 0) {
    local_14 = clauseId;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->queue_,&local_14);
    puVar1 = &(this->super_SatPreprocessor).clauses_.ebo_.buf[local_14]->field_0x8;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x40000000;
  }
  return;
}

Assistant:

void SatElite::addToSubQueue(uint32 clauseId) {
	assert(clause(clauseId) != 0);
	if (!clause(clauseId)->inQ()) {
		queue_.push_back(clauseId);
		clause(clauseId)->setInQ(true);
	}
}